

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

void __thiscall Token::Token(Token *this,TokenType type,char value1,char value2)

{
  this->mType = type;
  NumericConstant::NumericConstant(&this->mNumericValue);
  this->mCharValue = value1;
  this->mCharValue2 = value1;
  (this->mIdentifier)._M_dataplus._M_p = (pointer)&(this->mIdentifier).field_2;
  (this->mIdentifier)._M_string_length = 0;
  (this->mIdentifier).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Token::Token(TokenType type, char value1, char value2)
	: mType(type),
	  mNumericValue(),
	  mCharValue(value1),
	  mCharValue2(value1) {

}